

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<const_kj::ReadableDirectory_*> * __thiscall
kj::ArrayBuilder<const_kj::ReadableDirectory_*>::operator=
          (ArrayBuilder<const_kj::ReadableDirectory_*> *this,
          ArrayBuilder<const_kj::ReadableDirectory_*> *other)

{
  RemoveConst<const_kj::ReadableDirectory_*> *ppRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  ppRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (ReadableDirectory **)0x0;
  other->pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
  other->endPtr = (ReadableDirectory **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }